

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineViewportStateCreateInfo *state)

{
  uint uVar1;
  VkViewport *__first;
  VkRect2D *__first_00;
  reference pvVar2;
  reference pvVar3;
  allocator<vk::VkRect2D> local_61;
  vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_> local_60;
  allocator<vk::VkViewport> local_31;
  vector<vk::VkViewport,_std::allocator<vk::VkViewport>_> local_30;
  VkPipelineViewportStateCreateInfo *local_18;
  VkPipelineViewportStateCreateInfo *state_local;
  PipelineCreateInfo *this_local;
  
  __first = state->pViewports;
  uVar1 = state->viewportCount;
  local_18 = state;
  state_local = (VkPipelineViewportStateCreateInfo *)this;
  std::allocator<vk::VkViewport>::allocator(&local_31);
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)&local_30,__first,
             __first + uVar1,&local_31);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator=
            (&this->m_viewports,&local_30);
  std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::~vector(&local_30);
  std::allocator<vk::VkViewport>::~allocator(&local_31);
  __first_00 = local_18->pScissors;
  uVar1 = local_18->scissorCount;
  std::allocator<vk::VkRect2D>::allocator(&local_61);
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&local_60,__first_00,
             __first_00 + uVar1,&local_61);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator=(&this->m_scissors,&local_60);
  std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::~vector(&local_60);
  std::allocator<vk::VkRect2D>::~allocator(&local_61);
  memcpy(&this->m_viewportState,local_18,0x30);
  pvVar2 = std::vector<vk::VkViewport,_std::allocator<vk::VkViewport>_>::operator[]
                     (&this->m_viewports,0);
  (this->m_viewportState).pViewports = pvVar2;
  pvVar3 = std::vector<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>::operator[](&this->m_scissors,0)
  ;
  (this->m_viewportState).pScissors = pvVar3;
  (this->super_VkGraphicsPipelineCreateInfo).pViewportState = &this->m_viewportState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineViewportStateCreateInfo& state)
{
	m_viewports					= std::vector<vk::VkViewport>(state.pViewports, state.pViewports + state.viewportCount);
	m_scissors					= std::vector<vk::VkRect2D>(state.pScissors, state.pScissors + state.scissorCount);
	m_viewportState				= state;
	m_viewportState.pViewports	= &m_viewports[0];
	m_viewportState.pScissors	= &m_scissors[0];
	pViewportState				= &m_viewportState;

	return *this;
}